

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBox::contextMenuEvent(QAbstractSpinBox *this,QContextMenuEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  long lVar1;
  QWidget *this_01;
  int *piVar2;
  QAction *this_02;
  QAction *pQVar3;
  QAction *pQVar4;
  int *piVar5;
  QPoint QVar6;
  QAction *pQVar7;
  long lVar8;
  int iVar9;
  undefined8 uVar10;
  QWidget *pQVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QPoint local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  this_01 = &QLineEdit::createStandardContextMenu(this_00->edit)->super_QWidget;
  if (this_01 == (QWidget *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_01->super_QObject);
  }
  if (piVar2 == (int *)0x0) goto LAB_00482dab;
  if ((this_01 != (QWidget *)0x0) && (piVar2[1] != 0)) {
    QAbstractSpinBoxPrivate::reset(this_00);
    this_02 = (QAction *)operator_new(0x10);
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6ec565);
    pQVar11 = (QWidget *)0x0;
    if ((piVar2 != (int *)0x0) && (pQVar11 = (QWidget *)0x0, piVar2[1] != 0)) {
      pQVar11 = this_01;
    }
    QAction::QAction(this_02,(QString *)&local_50,&pQVar11->super_QObject);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QKeySequence::QKeySequence((QKeySequence *)&local_50,SelectAll);
    QAction::setShortcut((QKeySequence *)this_02);
    QKeySequence::~QKeySequence((QKeySequence *)&local_50);
    if (piVar2 == (int *)0x0) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar11 = (QWidget *)0x0;
      if (piVar2[1] != 0) {
        pQVar11 = this_01;
      }
    }
    lVar8 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
    lVar1 = *(long *)(lVar8 + 0x260);
    if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
      pQVar3 = (QAction *)0x0;
    }
    else {
      pQVar3 = *(QAction **)(lVar8 + 0x268);
    }
    QWidget::insertAction(pQVar11,pQVar3,this_02);
    if (piVar2 == (int *)0x0) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar11 = (QWidget *)0x0;
      if (piVar2[1] != 0) {
        pQVar11 = this_01;
      }
    }
    lVar8 = *(long *)&(this_00->edit->super_QWidget).field_0x8;
    lVar1 = *(long *)(lVar8 + 0x260);
    if ((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) {
      pQVar3 = (QAction *)0x0;
    }
    else {
      pQVar3 = *(QAction **)(lVar8 + 0x268);
    }
    QWidget::removeAction(pQVar11,pQVar3);
    QMenu::addSeparator((QMenu *)this_01);
    (**(code **)(*(long *)this + 0x1c8))(this);
    if (piVar2 == (int *)0x0) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar11 = (QWidget *)0x0;
      if (piVar2[1] != 0) {
        pQVar11 = this_01;
      }
    }
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6ec571);
    pQVar3 = QWidget::addAction(pQVar11,&local_50);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar3,0));
    if (piVar2 == (int *)0x0) {
      pQVar11 = (QWidget *)0x0;
    }
    else {
      pQVar11 = (QWidget *)0x0;
      if (piVar2[1] != 0) {
        pQVar11 = this_01;
      }
    }
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x6ec57a);
    pQVar4 = QWidget::addAction(pQVar11,&local_50);
    if ((QPoint)local_50.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
      UNLOCK();
      if (*(int *)local_50.d.d == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar4,0));
    QMenu::addSeparator((QMenu *)this_01);
    piVar5 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    if (event[0x38] == (QContextMenuEvent)0x0) {
      local_50.d.d = *(Data **)(event + 0x30);
    }
    else {
      local_58.xp.m_i = *(int *)(event + 0x28);
      local_58.yp.m_i = 0;
      QVar6 = QWidget::mapToGlobal((QWidget *)this,&local_58);
      lVar8 = *(long *)(this + 0x20);
      iVar9 = *(int *)(lVar8 + 0x1c) - *(int *)(lVar8 + 0x14);
      local_50.d.d._0_4_ = ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + QVar6.xp.m_i.m_i;
      iVar9 = *(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18);
      local_50.d.d._4_4_ = ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + QVar6.yp.m_i.m_i;
    }
    pQVar7 = QMenu::exec((QMenu *)this_01,(QPoint *)&local_50,(QAction *)0x0);
    pQVar11 = (QWidget *)0x0;
    if ((piVar2 != (int *)0x0) && (pQVar11 = this_01, piVar2[1] == 0)) {
      pQVar11 = (QWidget *)0x0;
    }
    if (pQVar11 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar11 + 0x20))(pQVar11);
    }
    if (piVar5 == (int *)0x0) {
      bVar12 = false;
    }
    else {
      bVar12 = piVar5[1] != 0;
    }
    if ((pQVar7 != (QAction *)0x0) && (bVar12)) {
      if (pQVar7 == pQVar3) {
        lVar8 = *(long *)this;
        uVar10 = 1;
      }
      else {
        if (pQVar7 != pQVar4) {
          if (pQVar7 == this_02) {
            selectAll(this);
          }
          goto LAB_00482d7c;
        }
        lVar8 = *(long *)this;
        uVar10 = 0xffffffff;
      }
      (**(code **)(lVar8 + 0x1b0))(this,uVar10);
    }
LAB_00482d7c:
    event[0xc] = (QContextMenuEvent)0x1;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        operator_delete(piVar5);
      }
    }
  }
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
LAB_00482dab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::contextMenuEvent(QContextMenuEvent *event)
{
#ifdef Q_OS_WASM
    if (!qstdweb::haveAsyncify()) {
        qDebug() << " Skipping context menu for spinbox since asyncify is off";
        return;
    }
#endif
    Q_D(QAbstractSpinBox);

    QPointer<QMenu> menu = d->edit->createStandardContextMenu();
    if (!menu)
        return;

    d->reset();

    QAction *selAll = new QAction(tr("&Select All"), menu);
#if QT_CONFIG(shortcut)
    selAll->setShortcut(QKeySequence::SelectAll);
#endif
    menu->insertAction(d->edit->d_func()->selectAllAction,
                      selAll);
    menu->removeAction(d->edit->d_func()->selectAllAction);
    menu->addSeparator();
    const uint se = stepEnabled();
    QAction *up = menu->addAction(tr("&Step up"));
    up->setEnabled(se & StepUpEnabled);
    QAction *down = menu->addAction(tr("Step &down"));
    down->setEnabled(se & StepDownEnabled);
    menu->addSeparator();

    const QPointer<QAbstractSpinBox> that = this;
    const QPoint pos = (event->reason() == QContextMenuEvent::Mouse)
        ? event->globalPos() : mapToGlobal(QPoint(event->pos().x(), 0)) + QPoint(width() / 2, height() / 2);
    const QAction *action = menu->exec(pos);
    delete static_cast<QMenu *>(menu);
    if (that && action) {
        if (action == up) {
            stepBy(1);
        } else if (action == down) {
            stepBy(-1);
        } else if (action == selAll) {
            selectAll();
        }
    }
    event->accept();
}